

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lu_dfs.c
# Opt level: O0

lu_int lu_dfs(lu_int i,lu_int *begin,lu_int *end,lu_int *index,lu_int top,lu_int *xi,lu_int *pstack,
             lu_int *marked,lu_int M)

{
  lu_int *in_RCX;
  lu_int *in_RDX;
  lu_int *in_RSI;
  int in_EDI;
  lu_int in_R8D;
  lu_int *in_R9;
  lu_int *in_stack_00000008;
  lu_int *in_stack_00000010;
  int in_stack_00000018;
  lu_int local_34;
  lu_int local_4;
  
  local_4 = in_R8D;
  if (in_stack_00000010[in_EDI] != in_stack_00000018) {
    if (in_RDX == (lu_int *)0x0) {
      local_34 = dfs(in_EDI,in_RSI,in_RCX,in_R8D,in_R9,in_stack_00000008,in_stack_00000010,
                     in_stack_00000018);
    }
    else {
      local_34 = dfs_end(in_EDI,in_RSI,in_RDX,in_RCX,in_R8D,in_R9,in_stack_00000008,
                         in_stack_00000010,in_stack_00000018);
    }
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

lu_int lu_dfs(
    lu_int i, const lu_int *begin, const lu_int *end, const lu_int *index,
    lu_int top, lu_int *xi, lu_int *pstack, lu_int *marked, const lu_int M)
{
    if (marked[i] == M)
        return top;

    return end ?
        dfs_end(i, begin, end, index, top, xi, pstack, marked, M) :
        dfs(i, begin, index, top, xi, pstack, marked, M);
}